

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.h
# Opt level: O0

void __thiscall merlin::cte::~cte(cte *this)

{
  edge *this_00;
  bool bVar1;
  reference ppeVar2;
  __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
  local_20;
  __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
  local_18;
  iterator i;
  cte *this_local;
  
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__cte_00297460;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&DAT_002974f8;
  i._M_current = (edge **)this;
  local_18._M_current =
       (edge **)std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::begin
                          (&this->m_edges);
  while( true ) {
    local_20._M_current =
         (edge **)std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::end
                            (&this->m_edges);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppeVar2 = __gnu_cxx::
              __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppeVar2;
    if (this_00 != (edge *)0x0) {
      detail::edge::~edge(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<merlin::detail::edge_**,_std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::clear
            (&this->m_edges);
  std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::clear
            (&this->m_messages);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_var2clique);
  std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::~vector
            (&this->m_messages);
  std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::~vector
            (&this->m_edges);
  std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::~vector
            (&this->m_clusters);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_evidence);
  factor::~factor(&this->m_marginal);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_query);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_beliefs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_order);
  graphical_model::~graphical_model(&this->m_gmo);
  algorithm::~algorithm(&this->super_algorithm);
  graphical_model::~graphical_model(&this->super_graphical_model);
  return;
}

Assistant:

~cte() {
		for (std::vector<detail::edge*>::iterator i = m_edges.begin();
				i != m_edges.end(); ++i) {
			delete *i;
		}
		m_edges.clear();
		m_messages.clear();
	}